

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_rotate.c
# Opt level: O0

void gdImageSkewX(gdImagePtr dst,gdImagePtr src,int uRow,int iOffset,double dWeight,int clrBack,
                 int ignoretransparent)

{
  uint uVar1;
  int x;
  int local_dc;
  int local_d4;
  int local_cc;
  uint local_c8;
  uint local_c0;
  uint local_b8;
  int local_b4;
  int local_ac;
  int local_a4;
  int local_a0;
  int local_98;
  int local_90;
  int local_8c;
  uint local_88;
  int local_84;
  int local_80;
  int local_7c;
  uint local_78;
  int local_74;
  int local_70;
  int local_6c;
  uint local_68;
  int pxlSrc;
  int pxlLeft;
  int pxlOldLeft;
  FuncPtr f;
  int clrBackA;
  int clrBackB;
  int clrBackG;
  int clrBackR;
  int a;
  int b;
  int g;
  int r;
  int i;
  int ignoretransparent_local;
  int clrBack_local;
  double dWeight_local;
  int iOffset_local;
  int uRow_local;
  gdImagePtr src_local;
  gdImagePtr dst_local;
  
  local_68 = 0;
  if (src->trueColor == 0) {
    if (src->trueColor == 0) {
      local_70 = src->red[clrBack];
    }
    else {
      local_70 = (int)(clrBack & 0xff0000U) >> 0x10;
    }
    if (src->trueColor == 0) {
      local_74 = src->green[clrBack];
    }
    else {
      local_74 = (int)(clrBack & 0xff00U) >> 8;
    }
    if (src->trueColor == 0) {
      local_78 = src->blue[clrBack];
    }
    else {
      local_78 = clrBack & 0xff;
    }
    if (src->trueColor == 0) {
      local_7c = src->alpha[clrBack];
    }
    else {
      local_7c = (int)(clrBack & 0x7f000000U) >> 0x18;
    }
    i = local_7c * 0x1000000 + local_70 * 0x10000 + local_74 * 0x100 + local_78;
    _pxlLeft = gdImageGetPixel;
  }
  else {
    _pxlLeft = gdImageGetTrueColorPixel;
    i = clrBack;
  }
  for (g = 0; g < iOffset; g = g + 1) {
    gdImageSetPixel(dst,g,uRow,i);
  }
  if (g < dst->sx) {
    gdImageSetPixel(dst,g,uRow,i);
  }
  pxlSrc = clrBack;
  for (g = 0; g < src->sx; g = g + 1) {
    uVar1 = (*_pxlLeft)(src,g,uRow);
    if (src->trueColor == 0) {
      local_80 = src->red[(int)uVar1];
    }
    else {
      local_80 = (int)(uVar1 & 0xff0000) >> 0x10;
    }
    if (src->trueColor == 0) {
      local_84 = src->green[(int)uVar1];
    }
    else {
      local_84 = (int)(uVar1 & 0xff00) >> 8;
    }
    if (src->trueColor == 0) {
      local_88 = src->blue[(int)uVar1];
    }
    else {
      local_88 = uVar1 & 0xff;
    }
    if (src->trueColor == 0) {
      local_8c = src->alpha[(int)uVar1];
    }
    else {
      local_8c = (int)(uVar1 & 0x7f000000) >> 0x18;
    }
    local_68 = gdImageColorAllocateAlpha
                         (src,(int)((double)local_80 * dWeight),(int)((double)local_84 * dWeight),
                          (int)((double)(int)local_88 * dWeight),(int)((double)local_8c * dWeight));
    if (local_68 == 0xffffffff) {
      local_68 = gdImageColorClosestAlpha
                           (src,(int)((double)local_80 * dWeight),(int)((double)local_84 * dWeight),
                            (int)((double)(int)local_88 * dWeight),(int)((double)local_8c * dWeight)
                           );
    }
    if (src->trueColor == 0) {
      local_90 = src->red[(int)uVar1];
    }
    else {
      local_90 = (int)(uVar1 & 0xff0000) >> 0x10;
    }
    if (src->trueColor == 0) {
      local_98 = src->red[(int)local_68];
    }
    else {
      local_98 = (int)(local_68 & 0xff0000) >> 0x10;
    }
    if (src->trueColor == 0) {
      local_a0 = src->red[pxlSrc];
    }
    else {
      local_a0 = (int)(pxlSrc & 0xff0000U) >> 0x10;
    }
    b = local_90 - (local_98 - local_a0);
    if (src->trueColor == 0) {
      local_a4 = src->green[(int)uVar1];
    }
    else {
      local_a4 = (int)(uVar1 & 0xff00) >> 8;
    }
    if (src->trueColor == 0) {
      local_ac = src->green[(int)local_68];
    }
    else {
      local_ac = (int)(local_68 & 0xff00) >> 8;
    }
    if (src->trueColor == 0) {
      local_b4 = src->green[pxlSrc];
    }
    else {
      local_b4 = (int)(pxlSrc & 0xff00U) >> 8;
    }
    a = local_a4 - (local_ac - local_b4);
    if (src->trueColor == 0) {
      local_b8 = src->blue[(int)uVar1];
    }
    else {
      local_b8 = uVar1 & 0xff;
    }
    if (src->trueColor == 0) {
      local_c0 = src->blue[(int)local_68];
    }
    else {
      local_c0 = local_68 & 0xff;
    }
    if (src->trueColor == 0) {
      local_c8 = src->blue[pxlSrc];
    }
    else {
      local_c8 = pxlSrc & 0xff;
    }
    clrBackR = local_b8 - (local_c0 - local_c8);
    if (src->trueColor == 0) {
      local_cc = src->alpha[(int)uVar1];
    }
    else {
      local_cc = (int)(uVar1 & 0x7f000000) >> 0x18;
    }
    if (src->trueColor == 0) {
      local_d4 = src->alpha[(int)local_68];
    }
    else {
      local_d4 = (int)(local_68 & 0x7f000000) >> 0x18;
    }
    if (src->trueColor == 0) {
      local_dc = src->alpha[pxlSrc];
    }
    else {
      local_dc = (int)(pxlSrc & 0x7f000000U) >> 0x18;
    }
    clrBackG = local_cc - (local_d4 - local_dc);
    if (0xff < b) {
      b = 0xff;
    }
    if (0xff < a) {
      a = 0xff;
    }
    if (0xff < clrBackR) {
      clrBackR = 0xff;
    }
    if (0x7f < clrBackG) {
      clrBackG = 0x7f;
    }
    if ((ignoretransparent == 0) || (uVar1 != dst->transparent)) {
      local_6c = gdImageColorAllocateAlpha(dst,b,a,clrBackR,clrBackG);
      if (local_6c == -1) {
        local_6c = gdImageColorClosestAlpha(dst,b,a,clrBackR,clrBackG);
      }
    }
    else {
      local_6c = dst->transparent;
    }
    if ((-1 < g + iOffset) && (g + iOffset < dst->sx)) {
      gdImageSetPixel(dst,g + iOffset,uRow,local_6c);
    }
    pxlSrc = local_68;
  }
  x = iOffset + g;
  if (x < dst->sx) {
    gdImageSetPixel(dst,x,uRow,local_68);
  }
  gdImageSetPixel(dst,iOffset,uRow,i);
  g = x + -1;
  while (g = g + 1, g < dst->sx) {
    gdImageSetPixel(dst,g,uRow,i);
  }
  return;
}

Assistant:

void gdImageSkewX (gdImagePtr dst, gdImagePtr src, int uRow, int iOffset, double dWeight, int clrBack, int ignoretransparent)
{
	int i, r, g, b, a, clrBackR, clrBackG, clrBackB, clrBackA;
	FuncPtr f;

	int pxlOldLeft, pxlLeft=0, pxlSrc;

	/* Keep clrBack as color index if required */
	if (src->trueColor) {
		pxlOldLeft = clrBack;
		f = gdImageGetTrueColorPixel;
	} else {
		pxlOldLeft = clrBack;
		clrBackR = gdImageRed(src, clrBack);
		clrBackG = gdImageGreen(src, clrBack);
		clrBackB = gdImageBlue(src, clrBack);
		clrBackA = gdImageAlpha(src, clrBack);
		clrBack =  gdTrueColorAlpha(clrBackR, clrBackG, clrBackB, clrBackA);
		f = gdImageGetPixel;
	}

	for (i = 0; i < iOffset; i++) {
		gdImageSetPixel (dst, i, uRow, clrBack);
	}

	if (i < dst->sx) {
		gdImageSetPixel (dst, i, uRow, clrBack);
	}

	for (i = 0; i < src->sx; i++) {
		pxlSrc = f (src,i,uRow);

		r = (int)(gdImageRed(src,pxlSrc) * dWeight);
		g = (int)(gdImageGreen(src,pxlSrc) * dWeight);
		b = (int)(gdImageBlue(src,pxlSrc) * dWeight);
		a = (int)(gdImageAlpha(src,pxlSrc) * dWeight);

		pxlLeft = gdImageColorAllocateAlpha(src, r, g, b, a);

		if (pxlLeft == -1) {
			pxlLeft = gdImageColorClosestAlpha(src, r, g, b, a);
		}

		r = gdImageRed(src,pxlSrc) - (gdImageRed(src,pxlLeft) - gdImageRed(src,pxlOldLeft));
		g = gdImageGreen(src,pxlSrc) - (gdImageGreen(src,pxlLeft) - gdImageGreen(src,pxlOldLeft));
		b = gdImageBlue(src,pxlSrc) - (gdImageBlue(src,pxlLeft) - gdImageBlue(src,pxlOldLeft));
		a = gdImageAlpha(src,pxlSrc) - (gdImageAlpha(src,pxlLeft) - gdImageAlpha(src,pxlOldLeft));

		if (r>255) {
			r = 255;
		}

		if (g>255) {
			g = 255;
		}

		if (b>255) {
			b = 255;
		}

		if (a>127) {
			a = 127;
		}

		if (ignoretransparent && pxlSrc == dst->transparent) {
			pxlSrc = dst->transparent;
		} else {
			pxlSrc = gdImageColorAllocateAlpha(dst, r, g, b, a);

			if (pxlSrc == -1) {
				pxlSrc = gdImageColorClosestAlpha(dst, r, g, b, a);
			}
		}

		if ((i + iOffset >= 0) && (i + iOffset < dst->sx)) {
			gdImageSetPixel (dst, i+iOffset, uRow,  pxlSrc);
		}

		pxlOldLeft = pxlLeft;
	}

	i += iOffset;

	if (i < dst->sx) {
		gdImageSetPixel (dst, i, uRow, pxlLeft);
	}

	gdImageSetPixel (dst, iOffset, uRow, clrBack);

	i--;

	while (++i < dst->sx) {
		gdImageSetPixel (dst, i, uRow, clrBack);
	}
}